

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_v8m_stackcheck_aarch64(CPUARMState_conflict *env,uint32_t newvalue)

{
  uint32_t uVar1;
  CPUState *cpu;
  uintptr_t unaff_retaddr;
  CPUState *cs;
  uint32_t newvalue_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = v7m_sp_limit(env);
  if (newvalue < uVar1) {
    cpu = env_cpu(env);
    cpu_restore_state_aarch64(cpu,unaff_retaddr,true);
    raise_exception_aarch64(env,0x13,0,1);
  }
  return;
}

Assistant:

void HELPER(v8m_stackcheck)(CPUARMState *env, uint32_t newvalue)
{
    /*
     * Perform the v8M stack limit check for SP updates from translated code,
     * raising an exception if the limit is breached.
     */
    if (newvalue < v7m_sp_limit(env)) {
        CPUState *cs = env_cpu(env);

        /*
         * Stack limit exceptions are a rare case, so rather than syncing
         * PC/condbits before the call, we use cpu_restore_state() to
         * get them right before raising the exception.
         */
        cpu_restore_state(cs, GETPC(), true);
        raise_exception(env, EXCP_STKOF, 0, 1);
    }
}